

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx::GridMeshISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,GridMeshISA *this,size_t buildID,BBox1f *time_range,
          SubGridBuildData *sgrids)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  long lVar17;
  ushort uVar18;
  ulong uVar19;
  ushort uVar20;
  ulong uVar21;
  BufferView<embree::Vec3fa> *pBVar22;
  BufferView<embree::Vec3fa> *pBVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar34;
  float fVar37;
  float fVar38;
  undefined1 auVar35 [16];
  float fVar39;
  undefined1 auVar36 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  
  uVar19 = (ulong)sgrids[buildID].sx & 0x7fff;
  uVar11 = (ulong)sgrids[buildID].sy & 0x7fff;
  lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
  lVar17 = (ulong)sgrids[buildID].primID * *(long *)&(this->super_GridMesh).field_0x68;
  fVar1 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
  fVar28 = (this->super_GridMesh).super_Geometry.time_range.lower;
  fVar56 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar28;
  fVar26 = (time_range->lower - fVar28) / fVar56;
  fVar56 = (time_range->upper - fVar28) / fVar56;
  fVar28 = fVar1 * fVar26;
  fVar31 = fVar56 * fVar1;
  auVar50 = vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),9);
  auVar27 = vroundss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),10);
  auVar36 = vmaxss_avx(auVar50,ZEXT816(0));
  fVar32 = auVar36._0_4_;
  iVar14 = -1;
  if (-1 < (int)auVar50._0_4_) {
    iVar14 = (int)auVar50._0_4_;
  }
  iVar6 = (int)fVar1 + 1;
  if ((int)auVar27._0_4_ < (int)fVar1 + 1) {
    iVar6 = (int)auVar27._0_4_;
  }
  auVar36 = vminss_avx(auVar27,ZEXT416((uint)fVar1));
  fVar33 = auVar36._0_4_;
  uVar2 = *(ushort *)(lVar4 + 10 + lVar17);
  uVar21 = (ulong)uVar2;
  if (uVar11 + 3 < (ulong)uVar2) {
    uVar21 = uVar11 + 3;
  }
  uVar20 = (ushort)uVar11;
  uVar18 = (ushort)uVar19;
  if (uVar20 < uVar2) {
    lVar7 = (long)(int)fVar32;
    uVar13 = uVar19 + 3;
    uVar3 = *(ushort *)(lVar4 + 8 + lVar17);
    uVar10 = (ulong)uVar3;
    if (uVar13 < uVar3) {
      uVar10 = uVar13;
    }
    pBVar22 = (this->super_GridMesh).vertices.items;
    pBVar23 = pBVar22 + lVar7;
    auVar59._8_4_ = 0x7f800000;
    auVar59._0_8_ = 0x7f8000007f800000;
    auVar59._12_4_ = 0x7f800000;
    auVar35._8_4_ = 0xff800000;
    auVar35._0_8_ = 0xff800000ff800000;
    auVar35._12_4_ = 0xff800000;
    auVar41._8_4_ = 0xddccb9a2;
    auVar41._0_8_ = 0xddccb9a2ddccb9a2;
    auVar41._12_4_ = 0xddccb9a2;
    auVar58._8_4_ = 0x5dccb9a2;
    auVar58._0_8_ = 0x5dccb9a25dccb9a2;
    auVar58._12_4_ = 0x5dccb9a2;
    auVar49 = ZEXT1664(auVar35);
    auVar51 = ZEXT1664(auVar59);
    uVar12 = uVar11;
    do {
      if (uVar18 < uVar3) {
        sVar5 = (pBVar23->super_RawBufferView).stride;
        pauVar15 = (undefined1 (*) [16])
                   ((pBVar23->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar12) *
                   sVar5);
        lVar16 = uVar10 - uVar19;
        do {
          auVar27 = *pauVar15;
          auVar36 = vcmpps_avx(auVar27,auVar41,6);
          auVar50 = vcmpps_avx(auVar27,auVar58,1);
          auVar36 = vandps_avx(auVar36,auVar50);
          uVar9 = vmovmskps_avx(auVar36);
          auVar50 = auVar35;
          auVar36 = auVar59;
          if ((~(byte)uVar9 & 7) != 0) goto LAB_012500aa;
          auVar36 = vminps_avx(auVar51._0_16_,auVar27);
          auVar51 = ZEXT1664(auVar36);
          auVar36 = vmaxps_avx(auVar49._0_16_,auVar27);
          auVar49 = ZEXT1664(auVar36);
          pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      auVar36 = auVar51._0_16_;
      auVar50 = auVar49._0_16_;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar21);
LAB_012500aa:
    lVar16 = (long)(int)fVar33;
    pBVar22 = pBVar22 + lVar16;
    auVar49 = ZEXT1664(auVar35);
    auVar51 = ZEXT1664(auVar59);
    uVar12 = uVar11;
    do {
      if (uVar18 < uVar3) {
        sVar5 = (pBVar22->super_RawBufferView).stride;
        pauVar15 = (undefined1 (*) [16])
                   ((pBVar22->super_RawBufferView).ptr_ofs +
                   (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar12) *
                   sVar5);
        lVar8 = uVar10 - uVar19;
        do {
          auVar27 = *pauVar15;
          auVar30 = vcmpps_avx(auVar27,auVar41,6);
          auVar54 = vcmpps_avx(auVar27,auVar58,1);
          auVar30 = vandps_avx(auVar30,auVar54);
          uVar9 = vmovmskps_avx(auVar30);
          auVar54 = auVar59;
          auVar52 = auVar35;
          if ((~(byte)uVar9 & 7) != 0) goto LAB_01250134;
          auVar30 = vminps_avx(auVar51._0_16_,auVar27);
          auVar51 = ZEXT1664(auVar30);
          auVar27 = vmaxps_avx(auVar49._0_16_,auVar27);
          auVar49 = ZEXT1664(auVar27);
          pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      auVar52 = auVar49._0_16_;
      auVar54 = auVar51._0_16_;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar21);
LAB_01250134:
    if (iVar6 - iVar14 != 1) {
      if (uVar20 < uVar2) {
        uVar3 = *(ushort *)(lVar4 + 8 + lVar17);
        uVar10 = (ulong)uVar3;
        if (uVar13 < uVar3) {
          uVar10 = uVar13;
        }
        pBVar23 = (this->super_GridMesh).vertices.items;
        auVar29._8_4_ = 0x7f800000;
        auVar29._0_8_ = 0x7f8000007f800000;
        auVar29._12_4_ = 0x7f800000;
        auVar27._8_4_ = 0xff800000;
        auVar27._0_8_ = 0xff800000ff800000;
        auVar27._12_4_ = 0xff800000;
        auVar49 = ZEXT1664(auVar27);
        auVar51 = ZEXT1664(auVar29);
        uVar13 = uVar11;
        do {
          if (uVar18 < uVar3) {
            sVar5 = pBVar23[lVar7 + 1].super_RawBufferView.stride;
            pauVar15 = (undefined1 (*) [16])
                       (pBVar23[lVar7 + 1].super_RawBufferView.ptr_ofs +
                       (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar13)
                       * sVar5);
            lVar8 = uVar10 - uVar19;
            do {
              auVar30 = *pauVar15;
              auVar35 = vcmpps_avx(auVar30,auVar41,6);
              auVar59 = vcmpps_avx(auVar30,auVar58,1);
              auVar35 = vandps_avx(auVar59,auVar35);
              uVar9 = vmovmskps_avx(auVar35);
              auVar35 = auVar27;
              auVar59 = auVar29;
              if ((~(byte)uVar9 & 7) != 0) goto LAB_012502cd;
              auVar35 = vminps_avx(auVar51._0_16_,auVar30);
              auVar51 = ZEXT1664(auVar35);
              auVar30 = vmaxps_avx(auVar49._0_16_,auVar30);
              auVar49 = ZEXT1664(auVar30);
              pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          auVar59 = auVar51._0_16_;
          auVar35 = auVar49._0_16_;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar21);
LAB_012502cd:
        auVar49 = ZEXT1664(auVar27);
        auVar51 = ZEXT1664(auVar29);
        uVar13 = uVar11;
        do {
          if (uVar18 < uVar3) {
            sVar5 = pBVar23[lVar16 + -1].super_RawBufferView.stride;
            pauVar15 = (undefined1 (*) [16])
                       (pBVar23[lVar16 + -1].super_RawBufferView.ptr_ofs +
                       (*(uint *)(lVar4 + lVar17) + uVar19 + *(uint *)(lVar4 + 4 + lVar17) * uVar13)
                       * sVar5);
            lVar7 = uVar10 - uVar19;
            do {
              auVar30 = *pauVar15;
              auVar29 = vcmpps_avx(auVar30,auVar41,6);
              auVar53 = vcmpps_avx(auVar30,auVar58,1);
              auVar29 = vandps_avx(auVar29,auVar53);
              uVar9 = vmovmskps_avx(auVar29);
              if ((~(byte)uVar9 & 7) != 0) {
                auVar30._8_4_ = 0x7f800000;
                auVar30._0_8_ = 0x7f8000007f800000;
                auVar30._12_4_ = 0x7f800000;
                goto LAB_012503a2;
              }
              auVar29 = vminps_avx(auVar51._0_16_,auVar30);
              auVar51 = ZEXT1664(auVar29);
              auVar30 = vmaxps_avx(auVar49._0_16_,auVar30);
              auVar49 = ZEXT1664(auVar30);
              pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar21);
        auVar27 = auVar49._0_16_;
        auVar30 = auVar51._0_16_;
      }
      else {
        auVar30._8_4_ = 0x7f800000;
        auVar30._0_8_ = 0x7f8000007f800000;
        auVar30._12_4_ = 0x7f800000;
        auVar27._8_4_ = 0xff800000;
        auVar27._0_8_ = 0xff800000ff800000;
        auVar27._12_4_ = 0xff800000;
        auVar35 = auVar27;
        auVar59 = auVar30;
      }
LAB_012503a2:
      auVar41 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar32)),ZEXT816(0) << 0x40);
      auVar58 = vshufps_avx(auVar41,auVar41,0);
      auVar41 = ZEXT416((uint)(1.0 - auVar41._0_4_));
      auVar41 = vshufps_avx(auVar41,auVar41,0);
      fVar40 = auVar41._0_4_ * auVar36._0_4_ + auVar59._0_4_ * auVar58._0_4_;
      fVar42 = auVar41._4_4_ * auVar36._4_4_ + auVar59._4_4_ * auVar58._4_4_;
      fVar43 = auVar41._8_4_ * auVar36._8_4_ + auVar59._8_4_ * auVar58._8_4_;
      fVar44 = auVar41._12_4_ * auVar36._12_4_ + auVar59._12_4_ * auVar58._12_4_;
      fVar45 = auVar41._0_4_ * auVar50._0_4_ + auVar35._0_4_ * auVar58._0_4_;
      fVar46 = auVar41._4_4_ * auVar50._4_4_ + auVar35._4_4_ * auVar58._4_4_;
      fVar47 = auVar41._8_4_ * auVar50._8_4_ + auVar35._8_4_ * auVar58._8_4_;
      fVar48 = auVar41._12_4_ * auVar50._12_4_ + auVar35._12_4_ * auVar58._12_4_;
      auVar36 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar31)),ZEXT816(0) << 0x40);
      auVar50 = vshufps_avx(auVar36,auVar36,0);
      auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
      auVar36 = vshufps_avx(auVar36,auVar36,0);
      fVar28 = auVar54._0_4_ * auVar36._0_4_ + auVar50._0_4_ * auVar30._0_4_;
      fVar31 = auVar54._4_4_ * auVar36._4_4_ + auVar50._4_4_ * auVar30._4_4_;
      fVar32 = auVar54._8_4_ * auVar36._8_4_ + auVar50._8_4_ * auVar30._8_4_;
      fVar33 = auVar54._12_4_ * auVar36._12_4_ + auVar50._12_4_ * auVar30._12_4_;
      local_78 = auVar27._0_4_;
      fStack_74 = auVar27._4_4_;
      fStack_70 = auVar27._8_4_;
      fStack_6c = auVar27._12_4_;
      fVar34 = auVar52._0_4_ * auVar36._0_4_ + auVar50._0_4_ * local_78;
      fVar37 = auVar52._4_4_ * auVar36._4_4_ + auVar50._4_4_ * fStack_74;
      fVar38 = auVar52._8_4_ * auVar36._8_4_ + auVar50._8_4_ * fStack_70;
      fVar39 = auVar52._12_4_ * auVar36._12_4_ + auVar50._12_4_ * fStack_6c;
      if ((int)(iVar14 + 1U) < iVar6) {
        uVar13 = (ulong)(iVar14 + 1U);
        auVar36._8_4_ = 0x7f800000;
        auVar36._0_8_ = 0x7f8000007f800000;
        auVar36._12_4_ = 0x7f800000;
        auVar50._8_4_ = 0xff800000;
        auVar50._0_8_ = 0xff800000ff800000;
        auVar50._12_4_ = 0xff800000;
        auVar53._8_4_ = 0xddccb9a2;
        auVar53._0_8_ = 0xddccb9a2ddccb9a2;
        auVar53._12_4_ = 0xddccb9a2;
        auVar55._8_4_ = 0x5dccb9a2;
        auVar55._0_8_ = 0x5dccb9a25dccb9a2;
        auVar55._12_4_ = 0x5dccb9a2;
        do {
          auVar27 = auVar50;
          auVar30 = auVar36;
          if (uVar20 < uVar2) {
            uVar3 = *(ushort *)(lVar4 + 8 + lVar17);
            uVar10 = (ulong)uVar3;
            if (uVar19 + 3 < (ulong)uVar3) {
              uVar10 = uVar19 + 3;
            }
            pBVar23 = (this->super_GridMesh).vertices.items + uVar13;
            auVar49 = ZEXT1664(auVar50);
            auVar51 = ZEXT1664(auVar36);
            uVar12 = uVar11;
            do {
              if (uVar18 < uVar3) {
                sVar5 = (pBVar23->super_RawBufferView).stride;
                pauVar15 = (undefined1 (*) [16])
                           ((pBVar23->super_RawBufferView).ptr_ofs +
                           (*(uint *)(lVar4 + lVar17) + uVar19 +
                           *(uint *)(lVar4 + 4 + lVar17) * uVar12) * sVar5);
                lVar7 = uVar10 - uVar19;
                do {
                  auVar35 = *pauVar15;
                  auVar27 = vcmpps_avx(auVar35,auVar53,6);
                  auVar30 = vcmpps_avx(auVar35,auVar55,1);
                  auVar27 = vandps_avx(auVar27,auVar30);
                  uVar9 = vmovmskps_avx(auVar27);
                  auVar27 = auVar50;
                  auVar30 = auVar36;
                  if ((~(byte)uVar9 & 7) != 0) goto LAB_0125051d;
                  auVar27 = vminps_avx(auVar51._0_16_,auVar35);
                  auVar51 = ZEXT1664(auVar27);
                  auVar27 = vmaxps_avx(auVar49._0_16_,auVar35);
                  auVar49 = ZEXT1664(auVar27);
                  pauVar15 = (undefined1 (*) [16])(*pauVar15 + sVar5);
                  lVar7 = lVar7 + -1;
                } while (lVar7 != 0);
              }
              auVar30 = auVar51._0_16_;
              auVar27 = auVar49._0_16_;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar21);
          }
LAB_0125051d:
          auVar24._0_4_ = ((float)(int)uVar13 / fVar1 - fVar26) / (fVar56 - fVar26);
          auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar35 = vshufps_avx(auVar24,auVar24,0);
          auVar59 = vshufps_avx(ZEXT416((uint)(1.0 - auVar24._0_4_)),
                                ZEXT416((uint)(1.0 - auVar24._0_4_)),0);
          auVar57._0_4_ = fVar28 * auVar35._0_4_ + fVar40 * auVar59._0_4_;
          auVar57._4_4_ = fVar31 * auVar35._4_4_ + fVar42 * auVar59._4_4_;
          auVar57._8_4_ = fVar32 * auVar35._8_4_ + fVar43 * auVar59._8_4_;
          auVar57._12_4_ = fVar33 * auVar35._12_4_ + fVar44 * auVar59._12_4_;
          auVar30 = vsubps_avx(auVar30,auVar57);
          auVar25._0_4_ = fVar34 * auVar35._0_4_ + fVar45 * auVar59._0_4_;
          auVar25._4_4_ = fVar37 * auVar35._4_4_ + fVar46 * auVar59._4_4_;
          auVar25._8_4_ = fVar38 * auVar35._8_4_ + fVar47 * auVar59._8_4_;
          auVar25._12_4_ = fVar39 * auVar35._12_4_ + fVar48 * auVar59._12_4_;
          auVar27 = vsubps_avx(auVar27,auVar25);
          auVar30 = vminps_avx(auVar30,ZEXT816(0) << 0x20);
          auVar27 = vmaxps_avx(auVar27,ZEXT816(0) << 0x20);
          fVar40 = fVar40 + auVar30._0_4_;
          fVar42 = fVar42 + auVar30._4_4_;
          fVar43 = fVar43 + auVar30._8_4_;
          fVar44 = fVar44 + auVar30._12_4_;
          fVar28 = fVar28 + auVar30._0_4_;
          fVar31 = fVar31 + auVar30._4_4_;
          fVar32 = fVar32 + auVar30._8_4_;
          fVar33 = fVar33 + auVar30._12_4_;
          fVar45 = fVar45 + auVar27._0_4_;
          fVar46 = fVar46 + auVar27._4_4_;
          fVar47 = fVar47 + auVar27._8_4_;
          fVar48 = fVar48 + auVar27._12_4_;
          fVar34 = fVar34 + auVar27._0_4_;
          fVar37 = fVar37 + auVar27._4_4_;
          fVar38 = fVar38 + auVar27._8_4_;
          fVar39 = fVar39 + auVar27._12_4_;
          uVar13 = uVar13 + 1;
        } while (iVar6 != (int)uVar13);
      }
      (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar40;
      (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar42;
      (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar43;
      (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar44;
      (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar45;
      (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar46;
      (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar47;
      (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar48;
      goto LAB_012505a3;
    }
  }
  else {
    auVar54._8_4_ = 0x7f800000;
    auVar54._0_8_ = 0x7f8000007f800000;
    auVar54._12_4_ = 0x7f800000;
    auVar52._8_4_ = 0xff800000;
    auVar52._0_8_ = 0xff800000ff800000;
    auVar52._12_4_ = 0xff800000;
    auVar36 = auVar54;
    auVar50 = auVar52;
    auVar27 = auVar52;
    auVar30 = auVar54;
    auVar35 = auVar52;
    auVar59 = auVar54;
    if (iVar6 - iVar14 != 1) goto LAB_012503a2;
  }
  auVar27 = vmaxss_avx(ZEXT416((uint)(fVar28 - fVar32)),ZEXT816(0) << 0x40);
  auVar30 = vshufps_avx(auVar27,auVar27,0);
  auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
       auVar36._0_4_ * auVar27._0_4_ + auVar54._0_4_ * auVar30._0_4_;
  (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
       auVar36._4_4_ * auVar27._4_4_ + auVar54._4_4_ * auVar30._4_4_;
  (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
       auVar36._8_4_ * auVar27._8_4_ + auVar54._8_4_ * auVar30._8_4_;
  (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
       auVar36._12_4_ * auVar27._12_4_ + auVar54._12_4_ * auVar30._12_4_;
  (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
       auVar27._0_4_ * auVar50._0_4_ + auVar52._0_4_ * auVar30._0_4_;
  (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
       auVar27._4_4_ * auVar50._4_4_ + auVar52._4_4_ * auVar30._4_4_;
  (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
       auVar27._8_4_ * auVar50._8_4_ + auVar52._8_4_ * auVar30._8_4_;
  (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
       auVar27._12_4_ * auVar50._12_4_ + auVar52._12_4_ * auVar30._12_4_;
  auVar27 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar31)),ZEXT816(0) << 0x40);
  auVar30 = vshufps_avx(auVar27,auVar27,0);
  auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  fVar28 = auVar36._0_4_ * auVar30._0_4_ + auVar54._0_4_ * auVar27._0_4_;
  fVar31 = auVar36._4_4_ * auVar30._4_4_ + auVar54._4_4_ * auVar27._4_4_;
  fVar32 = auVar36._8_4_ * auVar30._8_4_ + auVar54._8_4_ * auVar27._8_4_;
  fVar33 = auVar36._12_4_ * auVar30._12_4_ + auVar54._12_4_ * auVar27._12_4_;
  fVar34 = auVar30._0_4_ * auVar50._0_4_ + auVar52._0_4_ * auVar27._0_4_;
  fVar37 = auVar30._4_4_ * auVar50._4_4_ + auVar52._4_4_ * auVar27._4_4_;
  fVar38 = auVar30._8_4_ * auVar50._8_4_ + auVar52._8_4_ * auVar27._8_4_;
  fVar39 = auVar30._12_4_ * auVar50._12_4_ + auVar52._12_4_ * auVar27._12_4_;
LAB_012505a3:
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar28;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar31;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar32;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar33;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar34;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar37;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar38;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar39;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t buildID, const BBox1f& time_range, const SubGridBuildData * const sgrids) const override {
        const SubGridBuildData &subgrid = sgrids[buildID];                      
        const unsigned int primID = subgrid.primID;
        const size_t x = subgrid.x();
        const size_t y = subgrid.y();
        return linearBounds(grid(primID),x,y,time_range);
      }